

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *from)

{
  void *pvVar1;
  string *psVar2;
  StringVector *from_00;
  Int64Vector *from_01;
  StringVector *this_00;
  Int64Vector *this_01;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_003c5ac0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             &(from->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->iteminputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->iteminputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->iteminputfeaturename_,psVar2);
  }
  (this->numrecommendationsinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->numrecommendationsinputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->numrecommendationsinputfeaturename_,psVar2);
  }
  (this->itemrestrictioninputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->itemrestrictioninputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->itemrestrictioninputfeaturename_,psVar2);
  }
  (this->itemexclusioninputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->itemexclusioninputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->itemexclusioninputfeaturename_,psVar2);
  }
  (this->recommendeditemlistoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->recommendeditemlistoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->recommendeditemlistoutputfeaturename_,psVar2);
  }
  (this->recommendeditemscoreoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->recommendeditemscoreoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->recommendeditemscoreoutputfeaturename_,psVar2);
  }
  from_00 = from->itemstringids_;
  if (from_00 == (StringVector *)0x0 ||
      from == (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    this_00 = (StringVector *)0x0;
  }
  else {
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00,from_00);
  }
  this->itemstringids_ = this_00;
  from_01 = from->itemint64ids_;
  if (from_01 == (Int64Vector *)0x0 ||
      from == (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    this_01 = (Int64Vector *)0x0;
  }
  else {
    this_01 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_01,from_01);
  }
  this->itemint64ids_ = this_01;
  return;
}

Assistant:

ItemSimilarityRecommender::ItemSimilarityRecommender(const ItemSimilarityRecommender& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      itemitemsimilarities_(from.itemitemsimilarities_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  iteminputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.iteminputfeaturename().size() > 0) {
    iteminputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iteminputfeaturename_);
  }
  numrecommendationsinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.numrecommendationsinputfeaturename().size() > 0) {
    numrecommendationsinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.numrecommendationsinputfeaturename_);
  }
  itemrestrictioninputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.itemrestrictioninputfeaturename().size() > 0) {
    itemrestrictioninputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.itemrestrictioninputfeaturename_);
  }
  itemexclusioninputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.itemexclusioninputfeaturename().size() > 0) {
    itemexclusioninputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.itemexclusioninputfeaturename_);
  }
  recommendeditemlistoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.recommendeditemlistoutputfeaturename().size() > 0) {
    recommendeditemlistoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.recommendeditemlistoutputfeaturename_);
  }
  recommendeditemscoreoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.recommendeditemscoreoutputfeaturename().size() > 0) {
    recommendeditemscoreoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.recommendeditemscoreoutputfeaturename_);
  }
  if (from.has_itemstringids()) {
    itemstringids_ = new ::CoreML::Specification::StringVector(*from.itemstringids_);
  } else {
    itemstringids_ = NULL;
  }
  if (from.has_itemint64ids()) {
    itemint64ids_ = new ::CoreML::Specification::Int64Vector(*from.itemint64ids_);
  } else {
    itemint64ids_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ItemSimilarityRecommender)
}